

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O2

int32_t __thiscall
cornelich::cycle_formatter_yyyymmddhh::cycle_from_date_impl
          (cycle_formatter_yyyymmddhh *this,string *date)

{
  pointer pcVar1;
  bool bVar2;
  int64_t iVar3;
  int32_t iVar4;
  long *in_FS_OFFSET;
  int h;
  time_point ts;
  
  h = 0;
  iVar4 = -1;
  if (date->_M_string_length == 10) {
    bVar2 = parse_date(date,(day_point *)(*in_FS_OFFSET + -0x10));
    if (bVar2) {
      pcVar1 = (date->_M_dataplus)._M_p;
      bVar2 = util::parse_number<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(pcVar1 + 8),
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(pcVar1 + 10),&h);
      if ((bVar2) && ((long)h < 0x19)) {
        ts.__d.__r = (duration)(((long)(int)in_FS_OFFSET[-2] * 0x18 + (long)h) * 3600000000000);
        iVar3 = get_epoch_seconds(&ts);
        iVar4 = (int32_t)((iVar3 * 1000) / (long)(this->super_cycle_formatter).m_cycle_length);
      }
    }
  }
  return iVar4;
}

Assistant:

std::int32_t cycle_formatter_yyyymmddhh::cycle_from_date_impl(const std::string & date) const
{
    thread_local day_point dp;
    int h = 0;
    if(BOOST_UNLIKELY(date.length() != 10))
        return -1;
    if(BOOST_UNLIKELY(
                !parse_date(date, dp) ||
                !util::parse_number(date.begin() + 8, date.begin() + 10, h) || h > 24))
        return -1;
    system_clock::time_point ts = dp + hours(h);
    auto unix_timestamp = get_epoch_seconds(ts);

    return unix_timestamp * 1000 / m_cycle_length;
}